

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Util.cpp
# Opt level: O0

void slang::assert::assertFailed(char *expr,source_location *location)

{
  undefined8 uVar1;
  source_location *in_RSI;
  undefined8 in_RDI;
  string msg;
  undefined1 in_stack_00000100 [16];
  undefined1 in_stack_00000110 [16];
  string *in_stack_fffffffffffffe98;
  AssertionException *this;
  char *local_140;
  uint_least32_t local_134;
  char *local_130;
  char *local_128;
  undefined8 local_120;
  AssertionException local_118 [2];
  source_location *local_f8;
  undefined8 local_f0;
  undefined8 local_e8 [2];
  char *local_d8 [2];
  uint_least32_t local_c8 [4];
  undefined1 local_b8 [16];
  undefined8 local_a8;
  undefined8 *local_a0;
  char *local_98;
  undefined8 uStack_90;
  char **local_88;
  uint_least32_t *local_80;
  char **local_78;
  undefined8 *local_70;
  char *local_68;
  undefined8 uStack_60;
  AssertionException *local_58;
  undefined1 *local_48;
  char *local_40;
  char **local_38;
  undefined8 *local_28;
  uint_least32_t local_1c;
  uint_least32_t *local_18;
  undefined8 *local_10;
  undefined8 *local_8;
  
  local_128 = "Assertion \'{}\' failed\n  in file {}, line {}\n  function: {}\n";
  local_120 = 0x3b;
  local_f8 = in_RSI;
  local_f0 = in_RDI;
  local_130 = std::source_location::file_name(in_RSI);
  local_134 = std::source_location::line(local_f8);
  local_140 = std::source_location::function_name(local_f8);
  this = local_118;
  local_68 = local_128;
  uStack_60 = local_120;
  local_70 = &local_f0;
  local_78 = &local_130;
  local_80 = &local_134;
  local_88 = &local_140;
  local_98 = local_128;
  uStack_90 = local_120;
  local_28 = local_e8;
  local_e8[0] = local_f0;
  local_38 = local_d8;
  local_40 = local_130;
  local_18 = local_c8;
  local_1c = local_134;
  local_48 = local_b8;
  local_8 = &local_a8;
  local_a8 = 0xc2cc;
  local_58 = this;
  local_10 = local_28;
  local_d8[0] = local_40;
  local_c8[0] = local_1c;
  local_a0 = local_28;
  ::fmt::v11::vformat_abi_cxx11_((string_view)in_stack_00000110,(format_args)in_stack_00000100);
  uVar1 = __cxa_allocate_exception(0x10);
  AssertionException::AssertionException(this,in_stack_fffffffffffffe98);
  __cxa_throw(uVar1,&AssertionException::typeinfo,AssertionException::~AssertionException);
}

Assistant:

[[noreturn]] void assertFailed(const char* expr, const std::source_location& location) {
    auto msg = fmt::format("Assertion '{}' failed\n  in file {}, line {}\n"
                           "  function: {}\n",
                           expr, location.file_name(), location.line(), location.function_name());

#if __cpp_exceptions
    throw AssertionException(msg);
#else
    fprintf(stderr, "%s", msg.c_str());
    std::abort();
#endif
}